

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall
chrono::turtlebot::TurtleBot::TurtleBot
          (TurtleBot *this,ChSystem *system,ChVector<double> *robot_pos,
          ChQuaternion<double> *robot_rot,shared_ptr<chrono::ChMaterialSurface> *wheel_mat)

{
  bool bVar1;
  shared_ptr<chrono::ChMaterialSurface> local_60;
  shared_ptr<chrono::ChMaterialSurface> local_50;
  ChContactMethod local_40;
  ChContactMethod contact_method;
  shared_ptr<chrono::ChMaterialSurface> *local_30;
  shared_ptr<chrono::ChMaterialSurface> *wheel_mat_local;
  ChQuaternion<double> *robot_rot_local;
  ChVector<double> *robot_pos_local;
  ChSystem *system_local;
  TurtleBot *this_local;
  
  this->m_system = system;
  this->m_dc_motor_control = false;
  local_30 = wheel_mat;
  wheel_mat_local = (shared_ptr<chrono::ChMaterialSurface> *)robot_rot;
  robot_rot_local = (ChQuaternion<double> *)robot_pos;
  robot_pos_local = (ChVector<double> *)system;
  system_local = (ChSystem *)this;
  std::shared_ptr<chrono::turtlebot::Turtlebot_Chassis>::shared_ptr(&this->m_chassis);
  std::
  vector<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_ActiveWheel>_>_>
  ::vector(&this->m_drive_wheels);
  std::
  vector<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_PassiveWheel>_>_>
  ::vector(&this->m_passive_wheels);
  std::
  vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ::vector(&this->m_1st_level_rods);
  std::
  vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Short>_>_>
  ::vector(&this->m_2nd_level_rods);
  std::
  vector<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>,_std::allocator<std::shared_ptr<chrono::turtlebot::Turtlebot_Rod_Long>_>_>
  ::vector(&this->m_3rd_level_rods);
  std::shared_ptr<chrono::turtlebot::Turtlebot_BottomPlate>::shared_ptr(&this->m_bottom_plate);
  std::shared_ptr<chrono::turtlebot::Turtlebot_MiddlePlate>::shared_ptr(&this->m_middle_plate);
  std::shared_ptr<chrono::turtlebot::Turtlebot_TopPlate>::shared_ptr(&this->m_top_plate);
  ChQuaternion<double>::ChQuaternion(&this->m_robot_rot,(ChQuaternion<double> *)wheel_mat_local);
  ChVector<double>::ChVector(&this->m_robot_pos,(ChVector<double> *)robot_rot_local);
  std::
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  ::vector(&this->m_motors);
  std::
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ::vector(&this->m_motors_func);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_chassis_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheel_material,wheel_mat);
  local_40 = (**(code **)(*(long *)this->m_system + 0x178))();
  if (local_40 == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((turtlebot *)&local_50,local_40);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_chassis_material,&local_50);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_50);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_wheel_material);
  if (!bVar1) {
    DefaultContactMaterial((turtlebot *)&local_60,local_40);
    std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_wheel_material,&local_60);
    std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_60);
  }
  Create(this);
  return;
}

Assistant:

TurtleBot::TurtleBot(ChSystem* system,
                     const ChVector<>& robot_pos,
                     const ChQuaternion<>& robot_rot,
                     std::shared_ptr<ChMaterialSurface> wheel_mat)
    : m_system(system), m_robot_pos(robot_pos), m_robot_rot(robot_rot), m_wheel_material(wheel_mat) {
    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    auto contact_method = m_system->GetContactMethod();
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials
    m_chassis_material = DefaultContactMaterial(contact_method);
    if (!m_wheel_material)
        m_wheel_material = DefaultContactMaterial(contact_method);

    Create();
}